

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadLane<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  T val;
  Simd<unsigned_char,_(unsigned_char)__x10_> result;
  uchar local_21;
  anon_union_16_6_113bff37_for_Value_0 local_20;
  
  local_20.v128_.v = (v128)Pop(this);
  RVar1 = Load<unsigned_char>(this,instr,&local_21,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    *(uchar *)((long)&local_20 + (ulong)instr.field_2.imm_v128.v[8]) = local_21;
    Push(this,(Value)local_20.v128_.v);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  auto result = Pop<S>();
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  result[instr.imm_u32x2_u8.idx] = val;
  Push(result);
  return RunResult::Ok;
}